

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O0

int __thiscall Dymon::read_status(Dymon *this,uint8_t mode)

{
  int iVar1;
  uint32_t count;
  undefined2 local_1c;
  uint8_t local_1a;
  byte local_19;
  int status;
  uint8_t _statusRequest [3];
  uint8_t mode_local;
  Dymon *this_local;
  
  local_1c = 0x411b;
  local_1a = mode;
  local_19 = mode;
  _status = this;
  iVar1 = (*this->_vptr_Dymon[1])(this,&local_1c,3,0);
  if (iVar1 < 1) {
    this_local._4_4_ = -3;
  }
  else {
    count = (*this->_vptr_Dymon[2])(this,this->status,0x20);
    if ((int)count < 1) {
      this_local._4_4_ = -4;
    }
    else {
      if (dymonDebug != 0) {
        log_status((uint)local_19,this->status,count);
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Dymon::read_status(uint8_t mode) //request a status update
{
   uint8_t _statusRequest[] = {
      0x1B, 0x41, 0           //(A) status request
   };
   _statusRequest[2] = mode;

   int status = this->send(_statusRequest, sizeof(_statusRequest));
   if (status <= 0)
   {
      return -3;
   }
   status = this->receive(this->status, sizeof(this->status));
   if (status <= 0)
   {
      return -4;
   }
#if 1
   if (dymonDebug)
   {
      log_status(mode, this->status, status);
   }
#endif
   //success
   return 0;
}